

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

double __thiscall Quat4f::exp(Quat4f *this,double __x)

{
  long in_RSI;
  float fVar1;
  float fVar2;
  double dVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  float coeff;
  float theta;
  Quat4f *this_local;
  
  dVar3 = sqrt((double)(*(float *)(in_RSI + 0xc) * *(float *)(in_RSI + 0xc) +
                       *(float *)(in_RSI + 4) * *(float *)(in_RSI + 4) +
                       *(float *)(in_RSI + 8) * *(float *)(in_RSI + 8)));
  fVar1 = (float)dVar3;
  if (1e-06 <= fVar1) {
    dVar3 = sin((double)fVar1);
    fVar2 = (float)(dVar3 / (double)fVar1);
    dVar3 = cos((double)fVar1);
    Quat4f(this,(float)dVar3,*(float *)(in_RSI + 4) * fVar2,*(float *)(in_RSI + 8) * fVar2,
           *(float *)(in_RSI + 0xc) * fVar2);
    dVar3 = extraout_XMM0_Qa_00;
  }
  else {
    dVar3 = cos((double)fVar1);
    Quat4f(this,(float)dVar3,*(float *)(in_RSI + 4),*(float *)(in_RSI + 8),*(float *)(in_RSI + 0xc))
    ;
    dVar3 = extraout_XMM0_Qa;
  }
  return dVar3;
}

Assistant:

Quat4f Quat4f::exp() const
{
	float theta =
		sqrt
		(
			m_elements[ 1 ] * m_elements[ 1 ] +
			m_elements[ 2 ] * m_elements[ 2 ] +
			m_elements[ 3 ] * m_elements[ 3 ]
		);

	if( theta < 1e-6 )
	{
		return Quat4f( cos( theta ), m_elements[ 1 ], m_elements[ 2 ], m_elements[ 3 ] );
	}
	else
	{
		float coeff = sin( theta ) / theta;
		return Quat4f( cos( theta ), m_elements[ 1 ] * coeff, m_elements[ 2 ] * coeff, m_elements[ 3 ] * coeff );		
	}
}